

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O1

uchar PrologEncoderMD::GetXmmRegToSave(Instr *instr,unsigned_short *scaledOffset)

{
  byte bVar1;
  RegNum RVar2;
  int iVar3;
  Opnd *pOVar4;
  Func *pFVar5;
  code *pcVar6;
  bool bVar7;
  OpndKind OVar8;
  RegNum RVar9;
  undefined4 *puVar10;
  uint uVar11;
  
  if (scaledOffset == (unsigned_short *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x46,"(scaledOffset)","scaledOffset");
    if (!bVar7) goto LAB_0065495b;
    *puVar10 = 0;
  }
  if ((instr->m_opcode & ~ExtendedOpcodePrefix) != MOVAPD) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x47,
                       "(instr->m_opcode == Js::OpCode::MOVAPD || instr->m_opcode == Js::OpCode::MOVAPS)"
                       ,
                       "instr->m_opcode == Js::OpCode::MOVAPD || instr->m_opcode == Js::OpCode::MOVAPS"
                      );
    if (!bVar7) goto LAB_0065495b;
    *puVar10 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
LAB_00654618:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x48,"(instr->GetDst() && instr->GetDst()->IsIndirOpnd())",
                       "instr->GetDst() && instr->GetDst()->IsIndirOpnd()");
    if (!bVar7) goto LAB_0065495b;
    *puVar10 = 0;
  }
  else {
    OVar8 = IR::Opnd::GetKind(instr->m_dst);
    if (OVar8 != OpndKindIndir) goto LAB_00654618;
  }
  pOVar4 = instr->m_src1;
  OVar8 = IR::Opnd::GetKind(pOVar4);
  if (OVar8 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) goto LAB_0065495b;
    *puVar10 = 0;
  }
  bVar1 = *(byte *)((long)&pOVar4[1].m_valueType.field_0.bits + 1);
  pOVar4 = instr->m_dst;
  OVar8 = IR::Opnd::GetKind(pOVar4);
  if (OVar8 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar7) goto LAB_0065495b;
    *puVar10 = 0;
  }
  iVar3 = *(int *)&pOVar4[2]._vptr_Opnd;
  pOVar4 = instr->m_dst;
  OVar8 = IR::Opnd::GetKind(pOVar4);
  if (OVar8 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar7) goto LAB_0065495b;
    *puVar10 = 0;
  }
  RVar2 = *(RegNum *)((long)pOVar4[1]._vptr_Opnd + 0x19);
  RVar9 = LowererMDArch::GetRegStackPointer();
  if (RVar2 != RVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x50,
                       "(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetReg() == LowererMDArch::GetRegStackPointer())"
                       ,
                       "instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetReg() == LowererMDArch::GetRegStackPointer()"
                      );
    if (!bVar7) goto LAB_0065495b;
    *puVar10 = 0;
  }
  pFVar5 = instr->m_func->topFunc;
  uVar11 = iVar3 + pFVar5->m_argsSize + pFVar5->m_savedRegSize;
  if ((int)uVar11 < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x55,"(static_cast<int32>(offsetFromInstr) >= 0)",
                       "static_cast<int32>(offsetFromInstr) >= 0");
    if (!bVar7) goto LAB_0065495b;
    *puVar10 = 0;
  }
  if ((uVar11 + 0xf & 0xfffffff0) != uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x56,
                       "(::Math::Align(offsetFromInstr, static_cast<unsigned int>(MachDouble * 2)) == offsetFromInstr)"
                       ,
                       "::Math::Align(offsetFromInstr, static_cast<unsigned __int32>(MachDouble * 2)) == offsetFromInstr"
                      );
    if (!bVar7) goto LAB_0065495b;
    *puVar10 = 0;
  }
  if (0xfffff < uVar11) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x5d,"((!(((size_t)offsetFromInstr) & ~((size_t)0xFFFF))))",
                       "IS_UINT16(offsetFromInstr)");
    if (!bVar7) {
LAB_0065495b:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar10 = 0;
  }
  *scaledOffset = (unsigned_short)(uVar11 >> 4);
  return bVar1 - 0x11;
}

Assistant:

unsigned __int8 PrologEncoderMD::GetXmmRegToSave(IR::Instr *instr, unsigned __int16 *scaledOffset)
{
    Assert(scaledOffset);
    Assert(instr->m_opcode == Js::OpCode::MOVAPD || instr->m_opcode == Js::OpCode::MOVAPS);
    Assert(instr->GetDst() && instr->GetDst()->IsIndirOpnd());

    unsigned __int8 reg = ((instr->GetSrc1()->AsRegOpnd()->GetReg() - FIRST_XMM_REG) & 0xFF);
    unsigned __int32 offsetFromInstr = instr->GetDst()->AsIndirOpnd()->GetOffset();

    // The offset in the instruction is relative to the stack pointer before the saved reg size and stack args size were
    // subtracted, but the offset in the unwind info needs to be relative to the final stack pointer value
    // (see LowererMDArch::LowerEntryInstr), so adjust for that
    Assert(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetReg() == LowererMDArch::GetRegStackPointer());
    Func *const topFunc = instr->m_func->GetTopFunc();
    offsetFromInstr += topFunc->GetArgsSize() + topFunc->GetSavedRegSize();

    // Can only encode nonnegative 16-byte-aligned offsets in the unwind info
    Assert(static_cast<int32>(offsetFromInstr) >= 0);
    Assert(::Math::Align(offsetFromInstr, static_cast<unsigned __int32>(MachDouble * 2)) == offsetFromInstr);

    // Stored offset is scaled by 16
    offsetFromInstr /= MachDouble * 2;

    // We currently don't allow a total stack size greater than 1 MB. If we start allowing that, we will need to handle offsets
    // greater than (1 MB - 16) in the unwind info as well, for which a FAR version of the op-code is necessary.
    Assert(IS_UINT16(offsetFromInstr));

    *scaledOffset = TO_UINT16(offsetFromInstr);

    return reg;
}